

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

void __thiscall
pbrt::CameraBase::ApproximatedPdxy(CameraBase *this,SurfaceInteraction *si,int samplesPerPixel)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  bool bVar10;
  Point3fi *pPVar11;
  Point3fi *pPVar12;
  Float FVar13;
  Float FVar14;
  Float FVar15;
  float fVar16;
  undefined1 auVar19 [16];
  float fVar17;
  float fVar18;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  undefined8 uVar39;
  undefined1 auVar38 [64];
  float fVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  float z;
  float x;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  Point3f PVar48;
  Normal3f NVar49;
  Vector3f VVar50;
  Vector3f v_00;
  Transform DownZFromCamera;
  float local_158;
  float local_148;
  Transform local_e8;
  ulong local_68;
  undefined8 uStack_60;
  ulong local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  Vector3f v;
  undefined1 auVar40 [56];
  
  pPVar11 = &(si->super_Interaction).pi;
  pPVar12 = &(si->super_Interaction).pi;
  auVar19._0_4_ =
       (pPVar11->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar19._4_4_ =
       (pPVar11->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar19._8_4_ =
       (pPVar12->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar19._12_4_ =
       (pPVar12->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  uVar39 = *(undefined8 *)
            &(si->super_Interaction).pi.super_Point3<pbrt::Interval>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)(si->super_Interaction).pi.
                                                super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  auVar35._0_4_ = (float)uVar39 + auVar19._0_4_;
  auVar35._4_4_ = (float)((ulong)uVar39 >> 0x20) + auVar19._4_4_;
  auVar35._8_4_ = auVar19._8_4_ + 0.0;
  auVar35._12_4_ = auVar19._12_4_ + 0.0;
  auVar32._8_4_ = 0x3f000000;
  auVar32._0_8_ = 0x3f0000003f000000;
  auVar32._12_4_ = 0x3f000000;
  auVar19 = vmulps_avx512vl(auVar35,auVar32);
  PVar48.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar19._0_8_;
  PVar48.super_Tuple3<pbrt::Point3,_float>.z =
       ((si->super_Interaction).pi.super_Point3<pbrt::Interval>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
       (si->super_Interaction).pi.super_Point3<pbrt::Interval>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
  auVar40 = ZEXT856(auVar19._8_8_);
  PVar48 = AnimatedTransform::ApplyInverse
                     ((AnimatedTransform *)this,PVar48,(si->super_Interaction).time);
  fVar18 = PVar48.super_Tuple3<pbrt::Point3,_float>.z;
  auVar38._0_8_ = PVar48.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar38._8_56_ = auVar40;
  auVar32 = auVar38._0_16_;
  auVar19 = vmovshdup_avx(auVar32);
  uVar42 = 0;
  uVar43 = 0;
  uVar44 = 0;
  uVar39 = 0;
  NVar49 = AnimatedTransform::ApplyInverse
                     ((AnimatedTransform *)this,
                      (si->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>,
                      (si->super_Interaction).time);
  fVar47 = NVar49.super_Tuple3<pbrt::Normal3,_float>.z;
  local_38 = NVar49.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  local_158 = PVar48.super_Tuple3<pbrt::Point3,_float>.x;
  local_148 = auVar19._0_4_;
  fVar37 = fVar18 * fVar18 + local_158 * local_158 + local_148 * local_148;
  uStack_30 = uVar39;
  if (fVar37 < 0.0) {
    fVar37 = sqrtf(fVar37);
  }
  else {
    auVar35 = vsqrtss_avx(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37));
    fVar37 = auVar35._0_4_;
  }
  auVar20._4_4_ = fVar37;
  auVar20._0_4_ = fVar37;
  auVar20._8_4_ = fVar37;
  auVar20._12_4_ = fVar37;
  auVar35 = vdivps_avx(auVar32,auVar20);
  VVar50.super_Tuple3<pbrt::Vector3,_float>.z = fVar18 / fVar37;
  VVar50.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar35._0_8_;
  RotateFromTo(&local_e8,VVar50,(Vector3f)(ZEXT412(0x3f800000) << 0x40));
  FVar15 = local_e8.mInv.m[2][0];
  FVar14 = local_e8.mInv.m[1][0];
  FVar13 = local_e8.mInv.m[0][0];
  fVar37 = (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar1 = (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar2 = (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar3 = (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x;
  local_58 = CONCAT44(local_e8.mInv.m[0][2],local_e8.mInv.m[0][1]);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_58;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_58;
  local_68 = CONCAT44(local_e8.mInv.m[1][2],local_e8.mInv.m[1][1]);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_68;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_68;
  auVar31._4_4_ = local_e8.mInv.m[2][2];
  auVar31._0_4_ = local_e8.mInv.m[2][1];
  auVar31._8_8_ = 0;
  local_48._0_4_ = (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y;
  local_48._4_4_ = (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_40 = 0;
  fVar4 = (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar5 = (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar6 = (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar7 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar8 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar9 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar36 = 1.0;
  if (*(char *)(Options + 5) == '\0') {
    auVar23._0_4_ = (float)samplesPerPixel;
    auVar23._4_12_ = ZEXT812(0) << 0x20;
    if (auVar23._0_4_ < 0.0) {
      uStack_50 = 0;
      uStack_60 = 0;
      fVar36 = sqrtf(auVar23._0_4_);
      auVar34._8_8_ = uStack_60;
      auVar34._0_8_ = local_68;
      auVar30._8_8_ = uStack_50;
      auVar30._0_8_ = local_58;
    }
    else {
      auVar35 = vsqrtss_avx(auVar23,auVar23);
      fVar36 = auVar35._0_4_;
      auVar34 = auVar22;
      auVar30 = auVar21;
    }
    auVar35 = vmaxss_avx(ZEXT416((uint)(1.0 / fVar36)),ZEXT416(0x3e000000));
    fVar36 = auVar35._0_4_;
  }
  auVar19 = vmulss_avx512f(auVar19,ZEXT416((uint)local_e8.m.m[3][1]));
  auVar20 = vfmadd213ss_avx512f(ZEXT416((uint)local_e8.m.m[3][0]),auVar32,auVar19);
  auVar19 = vfmadd213ss_fma(ZEXT416((uint)local_e8.m.m[0][0]),auVar32,
                            ZEXT416((uint)(local_148 * local_e8.m.m[0][1])));
  auVar35 = vfmadd213ss_fma(ZEXT416((uint)local_e8.m.m[1][0]),auVar32,
                            ZEXT416((uint)(local_148 * local_e8.m.m[1][1])));
  auVar32 = vfmadd213ss_fma(ZEXT416((uint)local_e8.m.m[2][0]),auVar32,
                            ZEXT416((uint)(local_148 * local_e8.m.m[2][1])));
  auVar21 = vfmadd213ss_avx512f(ZEXT416((uint)local_e8.m.m[3][2]),ZEXT416((uint)fVar18),auVar20);
  auVar20 = vfmadd213ss_fma(ZEXT416((uint)local_e8.m.m[0][2]),ZEXT416((uint)fVar18),auVar19);
  auVar35 = vfmadd213ss_fma(ZEXT416((uint)local_e8.m.m[1][2]),ZEXT416((uint)fVar18),auVar35);
  auVar32 = vfmadd213ss_fma(ZEXT416((uint)local_e8.m.m[2][2]),ZEXT416((uint)fVar18),auVar32);
  auVar25._8_8_ = uStack_30;
  auVar25._0_8_ = local_38;
  auVar19 = vmovshdup_avx(auVar25);
  auVar22 = vmulss_avx512f(auVar19,ZEXT416((uint)FVar14));
  auVar22 = vfmadd213ss_avx512f(ZEXT416((uint)FVar13),auVar25,auVar22);
  auVar24._4_4_ = uVar42;
  auVar24._0_4_ = fVar47;
  auVar24._8_4_ = uVar43;
  auVar24._12_4_ = uVar44;
  auVar22 = vfmadd213ss_avx512f(auVar24,ZEXT416((uint)FVar15),auVar22);
  auVar21 = vaddss_avx512f(ZEXT416((uint)local_e8.m.m[3][3]),auVar21);
  fVar41 = auVar21._0_4_;
  bVar10 = fVar41 == 1.0;
  fVar18 = local_e8.m.m[0][3] + auVar20._0_4_;
  fVar16 = (float)((uint)bVar10 * (int)fVar18 + (uint)!bVar10 * (int)(fVar18 / fVar41));
  fVar18 = local_e8.m.m[1][3] + auVar35._0_4_;
  fVar17 = (float)((uint)bVar10 * (int)fVar18 + (uint)!bVar10 * (int)(fVar18 / fVar41));
  fVar18 = local_e8.m.m[2][3] + auVar32._0_4_;
  fVar18 = (float)((uint)bVar10 * (int)fVar18 + (uint)!bVar10 * (int)(fVar18 / fVar41));
  auVar20 = vaddss_avx512f(ZEXT416((uint)fVar9),SUB6416(ZEXT464(0x3f800000),0));
  auVar29._0_12_ = ZEXT812(0);
  auVar29._12_4_ = 0;
  fVar4 = fVar4 + 0.0;
  auVar21 = vaddss_avx512f(ZEXT416((uint)fVar5),auVar29);
  auVar23 = vaddss_avx512f(ZEXT416((uint)fVar6),auVar29);
  auVar24 = vaddss_avx512f(ZEXT416((uint)fVar7),auVar29);
  auVar25 = vaddss_avx512f(ZEXT416((uint)fVar8),auVar29);
  auVar26 = vaddss_avx512f(ZEXT416((uint)fVar37),auVar29);
  auVar27 = vaddss_avx512f(ZEXT416((uint)fVar1),auVar29);
  auVar28 = vaddss_avx512f(ZEXT416((uint)fVar2),auVar29);
  auVar29 = vaddss_avx512f(ZEXT416((uint)fVar3),auVar29);
  auVar19 = vmulps_avx512vl(auVar19,auVar34);
  auVar46._0_4_ = (undefined4)local_38;
  auVar46._4_4_ = auVar46._0_4_;
  auVar46._8_4_ = auVar46._0_4_;
  auVar46._12_4_ = auVar46._0_4_;
  auVar19 = vfmadd213ps_avx512vl(auVar46,auVar30,auVar19);
  auVar33._4_4_ = fVar47;
  auVar33._0_4_ = fVar47;
  auVar33._8_4_ = fVar47;
  auVar33._12_4_ = fVar47;
  auVar35 = vfmadd213ps_fma(auVar33,auVar31,auVar19);
  auVar19 = vmovshdup_avx(auVar35);
  fVar37 = auVar19._0_4_;
  auVar34 = ZEXT416((uint)(fVar37 * auVar23._0_4_));
  auVar32 = vfmadd213ss_fma(auVar21,auVar35,auVar34);
  auVar34 = vfmsub231ss_fma(auVar34,auVar19,auVar23);
  auVar34 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ + auVar34._0_4_)),auVar22,
                            ZEXT416((uint)fVar4));
  auVar32 = vfmadd213ss_fma(ZEXT416((uint)fVar17),auVar35,ZEXT416((uint)(fVar18 * fVar37)));
  auVar30 = vfmsub231ss_avx512f(ZEXT416((uint)(fVar18 * fVar37)),auVar19,ZEXT416((uint)fVar18));
  auVar31 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar32._0_4_ + auVar30._0_4_)),auVar22,
                                ZEXT416((uint)fVar16));
  auVar32 = ZEXT416((uint)(fVar37 * auVar20._0_4_));
  auVar30 = vfmadd213ss_avx512f(auVar25,auVar35,auVar32);
  auVar32 = vfmsub231ss_fma(auVar32,auVar19,auVar20);
  auVar32 = vaddss_avx512f(auVar30,auVar32);
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar34 = vxorps_avx512vl(ZEXT416((uint)(auVar34._0_4_ - auVar31._0_4_)),auVar33);
  auVar32 = vfmadd231ss_fma(auVar32,auVar22,auVar24);
  fVar47 = auVar34._0_4_ / auVar32._0_4_;
  auVar45._0_4_ = (float)local_48 + 0.0;
  auVar45._4_4_ = local_48._4_4_ + 1.0;
  auVar45._8_4_ = (float)uStack_40 + 0.0;
  auVar45._12_4_ = uStack_40._4_4_ + 0.0;
  auVar32 = ZEXT416((uint)(fVar37 * auVar28._0_4_));
  auVar34 = vfmadd213ss_fma(auVar27,auVar35,auVar32);
  auVar30 = vfmsub231ss_fma(auVar32,auVar19,auVar28);
  auVar32 = vmovshdup_avx(auVar45);
  auVar46 = ZEXT416((uint)(fVar37 * auVar32._0_4_));
  auVar19 = vxorps_avx512vl(auVar46,auVar33);
  auVar19 = vinsertps_avx(auVar46,auVar19,0x10);
  auVar19 = vfmadd231ps_fma(auVar19,auVar45,auVar35);
  auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar34._0_4_ + auVar30._0_4_)),auVar22,auVar26);
  auVar19 = vhaddps_avx(auVar19,auVar19);
  auVar35 = vxorps_avx512vl(ZEXT416((uint)(auVar35._0_4_ - auVar31._0_4_)),auVar33);
  auVar19 = vfmadd231ss_fma(auVar19,auVar29,auVar22);
  fVar37 = auVar35._0_4_ / auVar19._0_4_;
  auVar35 = vsubss_avx512f(ZEXT416((uint)(auVar26._0_4_ + auVar29._0_4_ * fVar37)),
                           ZEXT416((uint)fVar16));
  auVar19 = vsubss_avx512f(ZEXT416((uint)(auVar27._0_4_ + auVar45._0_4_ * fVar37)),
                           ZEXT416((uint)fVar17));
  auVar34 = vsubss_avx512f(ZEXT416((uint)(auVar28._0_4_ + auVar32._0_4_ * fVar37)),
                           ZEXT416((uint)fVar18));
  fVar37 = auVar19._0_4_;
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar37 * local_e8.mInv.m[0][1])),auVar35,
                            ZEXT416((uint)local_e8.mInv.m[0][0]));
  auVar19 = vfmadd231ss_fma(auVar19,auVar34,ZEXT416((uint)local_e8.mInv.m[0][2]));
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar37 * local_e8.mInv.m[1][1])),auVar35,
                            ZEXT416((uint)local_e8.mInv.m[1][0]));
  auVar32 = vfmadd231ss_fma(auVar32,auVar34,ZEXT416((uint)local_e8.mInv.m[1][2]));
  auVar19 = vinsertps_avx(auVar19,auVar32,0x10);
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar37 * local_e8.mInv.m[2][1])),auVar35,
                            ZEXT416((uint)local_e8.mInv.m[2][0]));
  auVar32 = vfmadd231ss_fma(auVar32,auVar34,ZEXT416((uint)local_e8.mInv.m[2][2]));
  v.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar19._0_8_;
  v.super_Tuple3<pbrt::Vector3,_float>.z = auVar32._0_4_;
  uVar39 = auVar19._8_8_;
  VVar50 = AnimatedTransform::operator()((AnimatedTransform *)this,v,(si->super_Interaction).time);
  auVar26._0_4_ = fVar36 * VVar50.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar26._4_4_ = fVar36 * VVar50.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar26._8_4_ = fVar36 * (float)uVar39;
  auVar26._12_4_ = fVar36 * (float)((ulong)uVar39 >> 0x20);
  uVar39 = vmovlps_avx(auVar26);
  (si->dpdx).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar39;
  (si->dpdx).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar39 >> 0x20);
  (si->dpdx).super_Tuple3<pbrt::Vector3,_float>.z =
       fVar36 * VVar50.super_Tuple3<pbrt::Vector3,_float>.z;
  fVar16 = (auVar24._0_4_ * fVar47 + fVar4) - fVar16;
  fVar17 = (auVar21._0_4_ + auVar25._0_4_ * fVar47) - fVar17;
  fVar18 = (auVar23._0_4_ + fVar47 * auVar20._0_4_) - fVar18;
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * local_e8.mInv.m[0][1])),ZEXT416((uint)fVar16),
                            ZEXT416((uint)local_e8.mInv.m[0][0]));
  auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar18),ZEXT416((uint)local_e8.mInv.m[0][2]));
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * local_e8.mInv.m[1][1])),ZEXT416((uint)fVar16),
                            ZEXT416((uint)local_e8.mInv.m[1][0]));
  auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)fVar18),ZEXT416((uint)local_e8.mInv.m[1][2]));
  auVar19 = vinsertps_avx(auVar19,auVar32,0x10);
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * local_e8.mInv.m[2][1])),ZEXT416((uint)fVar16),
                            ZEXT416((uint)local_e8.mInv.m[2][0]));
  auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)fVar18),ZEXT416((uint)local_e8.mInv.m[2][2]));
  v_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar19._0_8_;
  v_00.super_Tuple3<pbrt::Vector3,_float>.z = auVar32._0_4_;
  uVar39 = auVar19._8_8_;
  VVar50 = AnimatedTransform::operator()
                     ((AnimatedTransform *)this,v_00,(si->super_Interaction).time);
  auVar27._0_4_ = VVar50.super_Tuple3<pbrt::Vector3,_float>.x * fVar36;
  auVar27._4_4_ = VVar50.super_Tuple3<pbrt::Vector3,_float>.y * fVar36;
  auVar27._8_4_ = (float)uVar39 * fVar36;
  auVar27._12_4_ = (float)((ulong)uVar39 >> 0x20) * fVar36;
  uVar39 = vmovlps_avx(auVar27);
  (si->dpdy).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar39;
  (si->dpdy).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar39 >> 0x20);
  (si->dpdy).super_Tuple3<pbrt::Vector3,_float>.z =
       VVar50.super_Tuple3<pbrt::Vector3,_float>.z * fVar36;
  return;
}

Assistant:

void CameraBase::ApproximatedPdxy(SurfaceInteraction &si, int samplesPerPixel) const {
    // Compute tangent plane equation for ray differential intersections
    Point3f pCamera = CameraFromRender(si.p(), si.time);
    Normal3f nCamera = CameraFromRender(si.n, si.time);
    Transform DownZFromCamera =
        RotateFromTo(Normalize(Vector3f(pCamera)), Vector3f(0, 0, 1));
    Point3f pDownZ = DownZFromCamera(pCamera);
    Normal3f nDownZ = DownZFromCamera(nCamera);
    Float d = Dot(nDownZ, Vector3f(pDownZ));

    // Find intersection points for approximated camera differential rays
    Ray xRay(Point3f(0, 0, 0) + minPosDifferentialX,
             Vector3f(0, 0, 1) + minDirDifferentialX);
    Float tx = -(Dot(nDownZ, Vector3f(xRay.o)) - d) / Dot(nDownZ, xRay.d);
    Ray yRay(Point3f(0, 0, 0) + minPosDifferentialY,
             Vector3f(0, 0, 1) + minDirDifferentialY);
    Float ty = -(Dot(nDownZ, Vector3f(yRay.o)) - d) / Dot(nDownZ, yRay.d);
    Point3f px = xRay(tx), py = yRay(ty);

    // Estimate $\dpdx$ and $\dpdy$ in tangent plane at intersection point
    Float sppScale = GetOptions().disablePixelJitter
                         ? 1
                         : std::max<Float>(.125, 1 / std::sqrt((Float)samplesPerPixel));
    si.dpdx =
        sppScale * RenderFromCamera(DownZFromCamera.ApplyInverse(px - pDownZ), si.time);
    si.dpdy =
        sppScale * RenderFromCamera(DownZFromCamera.ApplyInverse(py - pDownZ), si.time);
}